

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextodfwriter.cpp
# Opt level: O0

void __thiscall
QTextOdfWriter::writeBlockFormat
          (QTextOdfWriter *this,QXmlStreamWriter *writer,QTextBlockFormat *format,int formatIndex)

{
  qreal qVar1;
  bool bVar2;
  QFlags<Qt::AlignmentFlag> QVar3;
  int iVar4;
  Int IVar5;
  QDebug *o;
  iterator o_00;
  Tab *pTVar6;
  QColor *in_RSI;
  long in_FS_OFFSET;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QByteArrayView QVar24;
  QByteArrayView QVar25;
  QByteArrayView QVar26;
  QByteArrayView QVar27;
  QByteArrayView QVar28;
  QByteArrayView QVar29;
  QByteArrayView QVar30;
  QByteArrayView QVar31;
  QByteArrayView QVar32;
  QByteArrayView QVar33;
  QByteArrayView QVar34;
  QByteArrayView QVar35;
  QByteArrayView QVar36;
  QByteArrayView QVar37;
  QByteArrayView QVar38;
  QByteArrayView QVar39;
  QByteArrayView QVar40;
  QByteArrayView QVar41;
  QByteArrayView QVar42;
  QByteArrayView QVar43;
  QByteArrayView QVar44;
  QByteArrayView QVar45;
  QByteArrayView QVar46;
  QByteArrayView QVar47;
  QByteArrayView QVar48;
  int blockLineHeightType;
  QString type_1;
  Iterator iterator;
  QList<QTextOption::Tab> tabs;
  QBrush brush;
  QString value_1;
  Alignment alignment;
  QString value;
  QString type;
  qreal blockLineHeight;
  undefined8 in_stack_fffffffffffff1c8;
  QStringBuilder<QString,_QString> *this_00;
  QString *other;
  undefined8 in_stack_fffffffffffff1d0;
  QStringBuilder<QString,_QString> *this_01;
  QString *this_02;
  undefined4 in_stack_fffffffffffff1d8;
  QFlagsStorage<Qt::AlignmentFlag> in_stack_fffffffffffff1dc;
  QColor *in_stack_fffffffffffff1e0;
  QDebug *in_stack_fffffffffffff1e8;
  QColor *pQVar49;
  QTextBlockFormat *in_stack_fffffffffffff1f0;
  undefined8 in_stack_fffffffffffff208;
  QFlagsStorage<Qt::AlignmentFlag> flags;
  char *in_stack_fffffffffffff218;
  QStringBuilder<QString,_QString> *local_ce0;
  storage_type *local_cd8;
  undefined1 local_cc8 [40];
  QAnyStringView *local_ca0;
  QAnyStringView *local_c98;
  QStringBuilder<QString,_QString> *local_c88;
  storage_type *local_c80;
  undefined1 local_c70 [40];
  QAnyStringView *local_c48;
  QAnyStringView *local_c40;
  storage_type *local_c38;
  undefined1 local_c28 [24];
  storage_type *local_c10;
  undefined1 local_c00 [24];
  storage_type *local_be8;
  undefined1 local_bd8 [24];
  storage_type *local_bc0;
  undefined1 local_bb0 [24];
  undefined1 *local_b98;
  undefined1 *puStack_b90;
  undefined1 *local_b88;
  QString *local_b60;
  QString *pQStack_b58;
  storage_type *local_b50;
  undefined1 local_b40 [40];
  QAnyStringView *local_b18;
  QAnyStringView *local_b10;
  storage_type *local_b08;
  undefined1 local_af8 [40];
  QAnyStringView *local_ad0;
  iterator local_ac0;
  storage_type *local_ab8;
  undefined1 local_aa8 [40];
  QAnyStringView *local_a80;
  undefined1 *local_a70;
  undefined1 *local_a68;
  undefined1 *local_a60;
  storage_type *local_a58;
  storage_type *local_a48;
  undefined1 local_a38 [32];
  QStringBuilder<QString,_QString> *local_a18;
  storage_type *local_a10;
  undefined1 local_a00 [40];
  QAnyStringView *local_9d8;
  QAnyStringView *local_9d0;
  QStringBuilder<QString,_QString> *local_9a8;
  storage_type *local_9a0;
  undefined1 local_990 [40];
  QAnyStringView *local_968;
  QAnyStringView *local_960;
  undefined1 *local_958;
  storage_type *local_950;
  undefined1 local_940 [24];
  QStringBuilder<QString,_QString> *local_928;
  QStringBuilder<QString,_QString> *local_920;
  storage_type *local_918;
  undefined1 local_908 [40];
  QAnyStringView *local_8e0;
  QAnyStringView *local_8d8;
  QFlagsStorageHelper<QTextFormat::PageBreakFlag,_4> local_8d0;
  QFlagsStorageHelper<QTextFormat::PageBreakFlag,_4> local_8cc;
  storage_type *local_8c8;
  undefined1 local_8b8 [24];
  QStringBuilder<QString,_QString> *local_8a0;
  QStringBuilder<QString,_QString> *local_898;
  storage_type *local_890;
  undefined1 local_880 [40];
  QAnyStringView *local_858;
  QAnyStringView *local_850;
  QFlagsStorageHelper<QTextFormat::PageBreakFlag,_4> local_848;
  QFlagsStorageHelper<QTextFormat::PageBreakFlag,_4> local_844;
  QStringBuilder<QString,_QString> *local_828;
  QStringBuilder<QString,_QString> *local_820;
  storage_type *local_818;
  undefined1 local_808 [40];
  QAnyStringView *local_7e0;
  QAnyStringView *local_7d8;
  qreal local_7d0;
  double local_7c8 [4];
  QStringBuilder<QString,_QString> *local_7a8;
  QStringBuilder<QString,_QString> *local_7a0;
  storage_type *local_798;
  undefined1 local_788 [40];
  QAnyStringView *local_760;
  QAnyStringView *local_758;
  double local_750;
  double local_748 [4];
  QStringBuilder<QString,_QString> *local_728;
  QStringBuilder<QString,_QString> *local_720;
  storage_type *local_718;
  undefined1 local_708 [40];
  QAnyStringView *local_6e0;
  QAnyStringView *local_6d8;
  qreal local_6d0;
  double local_6c8 [4];
  QStringBuilder<QString,_QString> *local_6a8;
  QStringBuilder<QString,_QString> *local_6a0;
  storage_type *local_698;
  undefined1 local_688 [40];
  QAnyStringView *local_660;
  QAnyStringView *local_658;
  qreal local_650;
  double local_648 [4];
  QStringBuilder<QString,_QString> *local_628;
  QStringBuilder<QString,_QString> *local_620;
  storage_type *local_618;
  undefined1 local_608 [40];
  QAnyStringView *local_5e0;
  QAnyStringView *local_5d8;
  QStringBuilder<QString,_QString> *local_5d0;
  QStringBuilder<QString,_QString> *local_5c8;
  storage_type *local_5c0;
  undefined1 local_5b0 [40];
  QAnyStringView *local_588;
  QAnyStringView *local_580;
  QDebug local_558;
  QDebug local_550;
  QDebug local_548;
  storage_type *local_540;
  undefined1 local_530 [28];
  Int local_514;
  storage_type *local_510;
  undefined1 local_500 [28];
  Int local_4e4;
  storage_type *local_4e0;
  undefined1 local_4d0 [28];
  QFlagsStorage<Qt::AlignmentFlag> local_4b4;
  storage_type *local_4b0;
  undefined1 local_4a0 [28];
  QFlagsStorage<Qt::AlignmentFlag> local_484;
  storage_type *local_480;
  undefined1 local_470 [28];
  Int local_454;
  storage_type *local_450;
  undefined1 local_440 [28];
  QFlagsStorage<Qt::AlignmentFlag> local_424;
  undefined1 *local_420;
  undefined1 *local_418;
  undefined1 *local_410;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_408;
  QFlagsStorage<Qt::AlignmentFlag> local_404;
  QStringBuilder<QString,_QString> *local_400;
  QStringBuilder<QString,_QString> *local_3f8;
  QAnyStringView *local_3e0;
  QAnyStringView *local_3d8;
  double local_3d0 [4];
  storage_type *local_3b0;
  undefined1 local_3a0 [24];
  double local_388 [4];
  storage_type *local_368;
  undefined1 local_358 [24];
  double local_340 [4];
  storage_type *local_320;
  undefined1 local_310 [24];
  storage_type *local_2f8;
  undefined1 local_2e8 [24];
  undefined1 local_2d0 [96];
  storage_type *local_270;
  undefined1 local_260 [24];
  storage_type *local_248;
  undefined1 local_238 [24];
  storage_type *local_220;
  undefined1 local_210 [24];
  undefined1 *local_1f8;
  undefined1 *puStack_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1d8;
  undefined1 *puStack_1d0;
  undefined1 *local_1c8;
  qreal local_1c0;
  storage_type *local_1b8;
  undefined1 local_1a8 [40];
  QAnyStringView *local_180;
  storage_type *local_170;
  undefined1 local_160 [24];
  QStringBuilder<QString,_QString> *local_148;
  QStringBuilder<QString,_QString> *local_140;
  storage_type *local_138;
  undefined1 local_128 [40];
  QAnyStringView *local_100;
  QAnyStringView *local_f8;
  QChar local_ea;
  storage_type *local_e8;
  undefined1 local_d8 [64];
  storage_type *local_98;
  undefined1 local_88 [40];
  QAnyStringView *local_60;
  QAnyStringView *local_58;
  storage_type *local_50;
  undefined1 local_40 [40];
  QAnyStringView *local_18;
  long local_8;
  
  flags.i = (Int)((ulong)in_stack_fffffffffffff208 >> 0x20);
  iVar4 = (int)((ulong)in_stack_fffffffffffff1c8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)in_stack_fffffffffffff1e0,
             (QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
  QByteArrayView::QByteArrayView<6ul>
            ((QByteArrayView *)in_stack_fffffffffffff1e0,
             (char (*) [6])CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
  QVar7.m_data = local_50;
  QVar7.m_size = (qsizetype)local_40;
  QString::fromLatin1(QVar7);
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)in_stack_fffffffffffff1e0,
             (QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
  QXmlStreamWriter::writeStartElement((QAnyStringView *)in_RSI,local_18);
  QString::~QString((QString *)0x9ef8a4);
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)in_stack_fffffffffffff1e0,
             (QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
  QByteArrayView::QByteArrayView<5ul>
            ((QByteArrayView *)in_stack_fffffffffffff1e0,
             (char (*) [5])CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
  QVar8.m_data = local_98;
  QVar8.m_size = (qsizetype)local_88;
  QString::fromLatin1(QVar8);
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)in_stack_fffffffffffff1e0,
             (QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
  QByteArrayView::QByteArrayView<4ul>
            ((QByteArrayView *)in_stack_fffffffffffff1e0,
             (char (*) [4])CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
  QVar9.m_data = local_e8;
  QVar9.m_size = (qsizetype)local_d8;
  QString::fromLatin1(QVar9);
  QChar::QChar<char16_t,_true>(&local_ea,L' ');
  QString::arg<int,_true>
            ((QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8),
             (int)((ulong)in_stack_fffffffffffff1d0 >> 0x20),(int)in_stack_fffffffffffff1d0,iVar4,
             (QChar)(char16_t)((ulong)in_stack_fffffffffffff1e8 >> 0x30));
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)in_stack_fffffffffffff1e0,
             (QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
  QXmlStreamWriter::writeAttribute((QAnyStringView *)in_RSI,local_60,local_58);
  QString::~QString((QString *)0x9ef9f8);
  QString::~QString((QString *)0x9efa05);
  QString::~QString((QString *)0x9efa12);
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)in_stack_fffffffffffff1e0,
             (QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
  QByteArrayView::QByteArrayView<7ul>
            ((QByteArrayView *)in_stack_fffffffffffff1e0,
             (char (*) [7])CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
  QVar10.m_data = local_138;
  QVar10.m_size = (qsizetype)local_128;
  QString::fromLatin1(QVar10);
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)in_stack_fffffffffffff1e0,
             (QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
  QByteArrayView::QByteArrayView<10ul>
            ((QByteArrayView *)in_stack_fffffffffffff1e0,
             (char (*) [10])CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
  QVar11.m_data = local_170;
  QVar11.m_size = (qsizetype)local_160;
  QString::fromLatin1(QVar11);
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)in_stack_fffffffffffff1e0,
             (QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
  QXmlStreamWriter::writeAttribute((QAnyStringView *)in_RSI,local_100,local_f8);
  QString::~QString((QString *)0x9efb19);
  QString::~QString((QString *)0x9efb26);
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)in_stack_fffffffffffff1e0,
             (QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
  QByteArrayView::QByteArrayView<21ul>
            ((QByteArrayView *)in_stack_fffffffffffff1e0,
             (char (*) [21])CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
  QVar12.m_data = local_1b8;
  QVar12.m_size = (qsizetype)local_1a8;
  QString::fromLatin1(QVar12);
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)in_stack_fffffffffffff1e0,
             (QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
  QXmlStreamWriter::writeStartElement((QAnyStringView *)in_RSI,local_180);
  QString::~QString((QString *)0x9efbcf);
  bVar2 = QTextFormat::hasProperty
                    ((QTextFormat *)in_stack_fffffffffffff1e0,in_stack_fffffffffffff1dc.i);
  this_00 = local_148;
  this_01 = local_140;
  if (bVar2) {
    iVar4 = QTextBlockFormat::lineHeightType((QTextBlockFormat *)0x9efbf7);
    local_1c0 = QTextBlockFormat::lineHeight((QTextBlockFormat *)0x9efc0b);
    local_1c8 = &DAT_aaaaaaaaaaaaaaaa;
    local_1d8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_1d0 = &DAT_aaaaaaaaaaaaaaaa;
    QString::QString((QString *)0x9efc4a);
    local_1e8 = &DAT_aaaaaaaaaaaaaaaa;
    local_1f8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_1f0 = &DAT_aaaaaaaaaaaaaaaa;
    QString::QString((QString *)0x9efc76);
    this_00 = local_148;
    this_01 = local_140;
    switch(iVar4) {
    case 0:
      QByteArrayView::QByteArrayView<12ul>
                ((QByteArrayView *)in_stack_fffffffffffff1e0,
                 (char (*) [12])CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
      QVar13.m_data = local_220;
      QVar13.m_size = (qsizetype)local_210;
      QString::fromLatin1(QVar13);
      QString::operator=(&local_140->a,&local_148->a);
      QString::~QString((QString *)0x9efcfb);
      QByteArrayView::QByteArrayView<5ul>
                ((QByteArrayView *)in_stack_fffffffffffff1e0,
                 (char (*) [5])CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
      QVar14.m_data = local_248;
      QVar14.m_size = (qsizetype)local_238;
      QString::fromLatin1(QVar14);
      QString::operator=(&local_140->a,&local_148->a);
      QString::~QString((QString *)0x9efd4e);
      this_00 = local_148;
      this_01 = local_140;
      break;
    case 1:
      QByteArrayView::QByteArrayView<12ul>
                ((QByteArrayView *)in_stack_fffffffffffff1e0,
                 (char (*) [12])CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
      QVar15.m_data = local_270;
      QVar15.m_size = (qsizetype)local_260;
      QString::fromLatin1(QVar15);
      QString::operator=(&local_140->a,&local_148->a);
      QString::~QString((QString *)0x9efda6);
      QString::number(local_1c0,(char)local_2d0,0x67);
      QByteArrayView::QByteArrayView<2ul>
                ((QByteArrayView *)in_stack_fffffffffffff1e0,
                 (char (*) [2])CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
      QVar16.m_data = local_2f8;
      QVar16.m_size = (qsizetype)local_2e8;
      QString::fromLatin1(QVar16);
      ::operator+((QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8),
                  &local_140->a);
      ::QStringBuilder::operator_cast_to_QString(local_148);
      QString::operator=(&local_140->a,&local_148->a);
      QString::~QString((QString *)0x9efe4b);
      QStringBuilder<QString,_QString>::~QStringBuilder(local_140);
      QString::~QString((QString *)0x9efe65);
      QString::~QString((QString *)0x9efe72);
      this_00 = local_148;
      this_01 = local_140;
      break;
    case 2:
      QByteArrayView::QByteArrayView<12ul>
                ((QByteArrayView *)in_stack_fffffffffffff1e0,
                 (char (*) [12])CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
      QVar17.m_data = local_320;
      QVar17.m_size = (qsizetype)local_310;
      QString::fromLatin1(QVar17);
      QString::operator=(&local_140->a,&local_148->a);
      QString::~QString((QString *)0x9efeca);
      local_340[0] = 0.0;
      qMax<double>(local_340,&local_1c0);
      pixelToPoint((qreal)in_stack_fffffffffffff1e0);
      QString::operator=(&local_140->a,&local_148->a);
      QString::~QString((QString *)0x9eff1e);
      this_00 = local_148;
      this_01 = local_140;
      break;
    case 3:
      QByteArrayView::QByteArrayView<21ul>
                ((QByteArrayView *)in_stack_fffffffffffff1e0,
                 (char (*) [21])CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
      QVar18.m_data = local_368;
      QVar18.m_size = (qsizetype)local_358;
      QString::fromLatin1(QVar18);
      QString::operator=(&local_140->a,&local_148->a);
      QString::~QString((QString *)0x9eff76);
      local_388[0] = 0.0;
      qMax<double>(local_388,&local_1c0);
      pixelToPoint((qreal)in_stack_fffffffffffff1e0);
      QString::operator=(&local_140->a,&local_148->a);
      QString::~QString((QString *)0x9effca);
      this_00 = local_148;
      this_01 = local_140;
      break;
    case 4:
      QByteArrayView::QByteArrayView<13ul>
                ((QByteArrayView *)in_stack_fffffffffffff1e0,
                 (char (*) [13])CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
      QVar19.m_data = local_3b0;
      QVar19.m_size = (qsizetype)local_3a0;
      QString::fromLatin1(QVar19);
      QString::operator=(&local_140->a,&local_148->a);
      QString::~QString((QString *)0x9f0022);
      local_3d0[0] = 0.0;
      qMax<double>(local_3d0,&local_1c0);
      pixelToPoint((qreal)in_stack_fffffffffffff1e0);
      QString::operator=(&local_140->a,&local_148->a);
      QString::~QString((QString *)0x9f0076);
      this_00 = local_148;
      this_01 = local_140;
    }
    bVar2 = QString::isNull((QString *)0x9f0083);
    if (!bVar2) {
      QAnyStringView::QAnyStringView
                ((QAnyStringView *)in_stack_fffffffffffff1e0,
                 (QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
      QAnyStringView::QAnyStringView
                ((QAnyStringView *)in_stack_fffffffffffff1e0,
                 (QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
      QAnyStringView::QAnyStringView
                ((QAnyStringView *)in_stack_fffffffffffff1e0,
                 (QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
      QXmlStreamWriter::writeAttribute((QAnyStringView *)in_RSI,local_3e0,local_3d8);
      this_00 = local_400;
      this_01 = local_3f8;
    }
    QString::~QString((QString *)0x9f0130);
    QString::~QString((QString *)0x9f013d);
  }
  bVar2 = QTextFormat::hasProperty
                    ((QTextFormat *)in_stack_fffffffffffff1e0,in_stack_fffffffffffff1dc.i);
  if (bVar2) {
    local_404.i = 0xaaaaaaaa;
    local_408.super_QFlagsStorage<Qt::AlignmentFlag>.i =
         (QFlagsStorage<Qt::AlignmentFlag>)QTextBlockFormat::alignment((QTextBlockFormat *)this_01);
    local_404.i = (Int)QFlags<Qt::AlignmentFlag>::operator&
                                 ((QFlags<Qt::AlignmentFlag> *)this_01,
                                  (AlignmentFlag)((ulong)this_00 >> 0x20));
    local_420 = &DAT_aaaaaaaaaaaaaaaa;
    local_418 = &DAT_aaaaaaaaaaaaaaaa;
    local_410 = &DAT_aaaaaaaaaaaaaaaa;
    QString::QString((QString *)0x9f01cc);
    local_424.i = local_404.i;
    bVar2 = ::operator==((QFlags<Qt::AlignmentFlag>)in_stack_fffffffffffff1dc.i,
                         (AlignmentFlag)this_01);
    if (bVar2) {
      QByteArrayView::QByteArrayView<6ul>
                ((QByteArrayView *)in_stack_fffffffffffff1e0,
                 (char (*) [6])CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
      QVar20.m_data = local_450;
      QVar20.m_size = (qsizetype)local_440;
      QString::fromLatin1(QVar20);
      QString::operator=(&this_01->a,&this_00->a);
      QString::~QString((QString *)0x9f0244);
    }
    else {
      local_454 = local_404.i;
      bVar2 = ::operator==((QFlags<Qt::AlignmentFlag>)in_stack_fffffffffffff1dc.i,
                           (AlignmentFlag)this_01);
      if (bVar2) {
        QByteArrayView::QByteArrayView<4ul>
                  ((QByteArrayView *)in_stack_fffffffffffff1e0,
                   (char (*) [4])CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
        QVar21.m_data = local_480;
        QVar21.m_size = (qsizetype)local_470;
        QString::fromLatin1(QVar21);
        QString::operator=(&this_01->a,&this_00->a);
        QString::~QString((QString *)0x9f02c1);
      }
      else {
        local_484.i = local_404.i;
        QVar3 = Qt::operator|((enum_type)((ulong)this_01 >> 0x20),(enum_type)this_01);
        bVar2 = ::operator==((QFlags<Qt::AlignmentFlag>)local_484.i,QVar3);
        if (bVar2) {
          QByteArrayView::QByteArrayView<5ul>
                    ((QByteArrayView *)in_stack_fffffffffffff1e0,
                     (char (*) [5])CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
          QVar22.m_data = local_4b0;
          QVar22.m_size = (qsizetype)local_4a0;
          QString::fromLatin1(QVar22);
          QString::operator=(&this_01->a,&this_00->a);
          QString::~QString((QString *)0x9f0356);
        }
        else {
          local_4b4.i = local_404.i;
          QVar3 = Qt::operator|((enum_type)((ulong)this_01 >> 0x20),(enum_type)this_01);
          bVar2 = ::operator==((QFlags<Qt::AlignmentFlag>)local_4b4.i,QVar3);
          if (bVar2) {
            QByteArrayView::QByteArrayView<6ul>
                      ((QByteArrayView *)in_stack_fffffffffffff1e0,
                       (char (*) [6])CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8)
                      );
            QVar23.m_data = local_4e0;
            QVar23.m_size = (qsizetype)local_4d0;
            QString::fromLatin1(QVar23);
            QString::operator=(&this_01->a,&this_00->a);
            QString::~QString((QString *)0x9f03eb);
          }
          else {
            local_4e4 = local_404.i;
            bVar2 = ::operator==((QFlags<Qt::AlignmentFlag>)in_stack_fffffffffffff1dc.i,
                                 (AlignmentFlag)this_01);
            if (bVar2) {
              QByteArrayView::QByteArrayView<7ul>
                        ((QByteArrayView *)in_stack_fffffffffffff1e0,
                         (char (*) [7])
                         CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
              QVar24.m_data = local_510;
              QVar24.m_size = (qsizetype)local_500;
              QString::fromLatin1(QVar24);
              QString::operator=(&this_01->a,&this_00->a);
              QString::~QString((QString *)0x9f0468);
            }
            else {
              local_514 = local_404.i;
              bVar2 = ::operator==((QFlags<Qt::AlignmentFlag>)in_stack_fffffffffffff1dc.i,
                                   (AlignmentFlag)this_01);
              if (bVar2) {
                QByteArrayView::QByteArrayView<8ul>
                          ((QByteArrayView *)in_stack_fffffffffffff1e0,
                           (char (*) [8])
                           CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
                QVar25.m_data = local_540;
                QVar25.m_size = (qsizetype)local_530;
                QString::fromLatin1(QVar25);
                QString::operator=(&this_01->a,&this_00->a);
                QString::~QString((QString *)0x9f04e5);
              }
              else {
                QMessageLogger::QMessageLogger
                          ((QMessageLogger *)in_stack_fffffffffffff1e0,
                           (char *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8),
                           (int)((ulong)this_01 >> 0x20),(char *)this_00);
                QMessageLogger::warning();
                o = QDebug::operator<<(in_stack_fffffffffffff1e8,in_stack_fffffffffffff218);
                QDebug::QDebug(&local_550,o);
                QTextBlockFormat::alignment((QTextBlockFormat *)this_01);
                operator<<<QFlags<Qt::AlignmentFlag>,_true>
                          ((QDebug *)in_stack_fffffffffffff1f0,(QFlags<Qt::AlignmentFlag>)flags.i);
                QDebug::~QDebug(&local_548);
                QDebug::~QDebug(&local_550);
                QDebug::~QDebug(&local_558);
              }
            }
          }
        }
      }
    }
    bVar2 = QString::isNull((QString *)0x9f05a7);
    if (!bVar2) {
      QAnyStringView::QAnyStringView
                ((QAnyStringView *)in_stack_fffffffffffff1e0,
                 (QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
      QByteArrayView::QByteArrayView<11ul>
                ((QByteArrayView *)in_stack_fffffffffffff1e0,
                 (char (*) [11])CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
      QVar26.m_data = local_5c0;
      QVar26.m_size = (qsizetype)local_5b0;
      QString::fromLatin1(QVar26);
      QAnyStringView::QAnyStringView
                ((QAnyStringView *)in_stack_fffffffffffff1e0,
                 (QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
      QAnyStringView::QAnyStringView
                ((QAnyStringView *)in_stack_fffffffffffff1e0,
                 (QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
      QXmlStreamWriter::writeAttribute((QAnyStringView *)in_RSI,local_588,local_580);
      QString::~QString((QString *)0x9f0685);
      this_00 = local_5d0;
      this_01 = local_5c8;
    }
    QString::~QString((QString *)0x9f0692);
  }
  bVar2 = QTextFormat::hasProperty
                    ((QTextFormat *)in_stack_fffffffffffff1e0,in_stack_fffffffffffff1dc.i);
  if (bVar2) {
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffff1e0,
               (QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
    QByteArrayView::QByteArrayView<11ul>
              ((QByteArrayView *)in_stack_fffffffffffff1e0,
               (char (*) [11])CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
    QVar27.m_data = local_618;
    QVar27.m_size = (qsizetype)local_608;
    QString::fromLatin1(QVar27);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffff1e0,
               (QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
    local_648[0] = 0.0;
    local_650 = QTextBlockFormat::topMargin((QTextBlockFormat *)0x9f0735);
    qMax<double>(local_648,&local_650);
    pixelToPoint((qreal)in_stack_fffffffffffff1e0);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffff1e0,
               (QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
    QXmlStreamWriter::writeAttribute((QAnyStringView *)in_RSI,local_5e0,local_5d8);
    QString::~QString((QString *)0x9f07cb);
    QString::~QString((QString *)0x9f07d8);
    this_00 = local_628;
    this_01 = local_620;
  }
  bVar2 = QTextFormat::hasProperty
                    ((QTextFormat *)in_stack_fffffffffffff1e0,in_stack_fffffffffffff1dc.i);
  if (bVar2) {
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffff1e0,
               (QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
    QByteArrayView::QByteArrayView<14ul>
              ((QByteArrayView *)in_stack_fffffffffffff1e0,
               (char (*) [14])CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
    QVar28.m_data = local_698;
    QVar28.m_size = (qsizetype)local_688;
    QString::fromLatin1(QVar28);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffff1e0,
               (QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
    local_6c8[0] = 0.0;
    local_6d0 = QTextBlockFormat::bottomMargin((QTextBlockFormat *)0x9f087b);
    qMax<double>(local_6c8,&local_6d0);
    pixelToPoint((qreal)in_stack_fffffffffffff1e0);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffff1e0,
               (QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
    QXmlStreamWriter::writeAttribute((QAnyStringView *)in_RSI,local_660,local_658);
    QString::~QString((QString *)0x9f0911);
    QString::~QString((QString *)0x9f091e);
    this_00 = local_6a8;
    this_01 = local_6a0;
  }
  bVar2 = QTextFormat::hasProperty
                    ((QTextFormat *)in_stack_fffffffffffff1e0,in_stack_fffffffffffff1dc.i);
  if ((bVar2) ||
     (bVar2 = QTextFormat::hasProperty
                        ((QTextFormat *)in_stack_fffffffffffff1e0,in_stack_fffffffffffff1dc.i),
     bVar2)) {
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffff1e0,
               (QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
    QByteArrayView::QByteArrayView<12ul>
              ((QByteArrayView *)in_stack_fffffffffffff1e0,
               (char (*) [12])CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
    QVar29.m_data = local_718;
    QVar29.m_size = (qsizetype)local_708;
    QString::fromLatin1(QVar29);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffff1e0,
               (QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
    local_748[0] = 0.0;
    qVar1 = QTextBlockFormat::leftMargin((QTextBlockFormat *)0x9f09d7);
    iVar4 = QTextBlockFormat::indent((QTextBlockFormat *)0x9f09ed);
    local_750 = qVar1 + (double)iVar4;
    qMax<double>(local_748,&local_750);
    pixelToPoint((qreal)in_stack_fffffffffffff1e0);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffff1e0,
               (QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
    QXmlStreamWriter::writeAttribute((QAnyStringView *)in_RSI,local_6e0,local_6d8);
    QString::~QString((QString *)0x9f0a94);
    QString::~QString((QString *)0x9f0aa1);
    this_00 = local_728;
    this_01 = local_720;
  }
  bVar2 = QTextFormat::hasProperty
                    ((QTextFormat *)in_stack_fffffffffffff1e0,in_stack_fffffffffffff1dc.i);
  if (bVar2) {
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffff1e0,
               (QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
    QByteArrayView::QByteArrayView<13ul>
              ((QByteArrayView *)in_stack_fffffffffffff1e0,
               (char (*) [13])CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
    QVar30.m_data = local_798;
    QVar30.m_size = (qsizetype)local_788;
    QString::fromLatin1(QVar30);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffff1e0,
               (QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
    local_7c8[0] = 0.0;
    local_7d0 = QTextBlockFormat::rightMargin((QTextBlockFormat *)0x9f0b44);
    qMax<double>(local_7c8,&local_7d0);
    pixelToPoint((qreal)in_stack_fffffffffffff1e0);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffff1e0,
               (QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
    QXmlStreamWriter::writeAttribute((QAnyStringView *)in_RSI,local_760,local_758);
    QString::~QString((QString *)0x9f0bda);
    QString::~QString((QString *)0x9f0be7);
    this_00 = local_7a8;
    this_01 = local_7a0;
  }
  bVar2 = QTextFormat::hasProperty
                    ((QTextFormat *)in_stack_fffffffffffff1e0,in_stack_fffffffffffff1dc.i);
  if (bVar2) {
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffff1e0,
               (QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
    QByteArrayView::QByteArrayView<12ul>
              ((QByteArrayView *)in_stack_fffffffffffff1e0,
               (char (*) [12])CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
    QVar31.m_data = local_818;
    QVar31.m_size = (qsizetype)local_808;
    QString::fromLatin1(QVar31);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffff1e0,
               (QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
    QTextBlockFormat::textIndent((QTextBlockFormat *)0x9f0c7e);
    pixelToPoint((qreal)in_stack_fffffffffffff1e0);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffff1e0,
               (QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
    QXmlStreamWriter::writeAttribute((QAnyStringView *)in_RSI,local_7e0,local_7d8);
    QString::~QString((QString *)0x9f0cf2);
    QString::~QString((QString *)0x9f0cff);
    this_00 = local_828;
    this_01 = local_820;
  }
  bVar2 = QTextFormat::hasProperty
                    ((QTextFormat *)in_stack_fffffffffffff1e0,in_stack_fffffffffffff1dc.i);
  if (bVar2) {
    local_848.super_QFlagsStorage<QTextFormat::PageBreakFlag>.i =
         (QFlagsStorage<QTextFormat::PageBreakFlag>)
         QTextBlockFormat::pageBreakPolicy((QTextBlockFormat *)this_01);
    local_844.super_QFlagsStorage<QTextFormat::PageBreakFlag>.i =
         (QFlagsStorage<QTextFormat::PageBreakFlag>)
         QFlags<QTextFormat::PageBreakFlag>::operator&
                   ((QFlags<QTextFormat::PageBreakFlag> *)this_01,
                    (PageBreakFlag)((ulong)this_00 >> 0x20));
    IVar5 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_844);
    if (IVar5 != 0) {
      QAnyStringView::QAnyStringView
                ((QAnyStringView *)in_stack_fffffffffffff1e0,
                 (QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
      QByteArrayView::QByteArrayView<13ul>
                ((QByteArrayView *)in_stack_fffffffffffff1e0,
                 (char (*) [13])CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
      QVar32.m_data = local_890;
      QVar32.m_size = (qsizetype)local_880;
      QString::fromLatin1(QVar32);
      QAnyStringView::QAnyStringView
                ((QAnyStringView *)in_stack_fffffffffffff1e0,
                 (QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
      QByteArrayView::QByteArrayView<5ul>
                ((QByteArrayView *)in_stack_fffffffffffff1e0,
                 (char (*) [5])CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
      QVar33.m_data = local_8c8;
      QVar33.m_size = (qsizetype)local_8b8;
      QString::fromLatin1(QVar33);
      QAnyStringView::QAnyStringView
                ((QAnyStringView *)in_stack_fffffffffffff1e0,
                 (QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
      QXmlStreamWriter::writeAttribute((QAnyStringView *)in_RSI,local_858,local_850);
      QString::~QString((QString *)0x9f0e64);
      QString::~QString((QString *)0x9f0e71);
      this_00 = local_8a0;
      this_01 = local_898;
    }
    local_8d0.super_QFlagsStorage<QTextFormat::PageBreakFlag>.i =
         (QFlagsStorage<QTextFormat::PageBreakFlag>)
         QTextBlockFormat::pageBreakPolicy((QTextBlockFormat *)this_01);
    local_8cc.super_QFlagsStorage<QTextFormat::PageBreakFlag>.i =
         (QFlagsStorage<QTextFormat::PageBreakFlag>)
         QFlags<QTextFormat::PageBreakFlag>::operator&
                   ((QFlags<QTextFormat::PageBreakFlag> *)this_01,
                    (PageBreakFlag)((ulong)this_00 >> 0x20));
    IVar5 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_8cc);
    if (IVar5 != 0) {
      QAnyStringView::QAnyStringView
                ((QAnyStringView *)in_stack_fffffffffffff1e0,
                 (QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
      QByteArrayView::QByteArrayView<12ul>
                ((QByteArrayView *)in_stack_fffffffffffff1e0,
                 (char (*) [12])CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
      QVar34.m_data = local_918;
      QVar34.m_size = (qsizetype)local_908;
      QString::fromLatin1(QVar34);
      QAnyStringView::QAnyStringView
                ((QAnyStringView *)in_stack_fffffffffffff1e0,
                 (QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
      QByteArrayView::QByteArrayView<5ul>
                ((QByteArrayView *)in_stack_fffffffffffff1e0,
                 (char (*) [5])CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
      QVar35.m_data = local_950;
      QVar35.m_size = (qsizetype)local_940;
      QString::fromLatin1(QVar35);
      QAnyStringView::QAnyStringView
                ((QAnyStringView *)in_stack_fffffffffffff1e0,
                 (QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
      QXmlStreamWriter::writeAttribute((QAnyStringView *)in_RSI,local_8e0,local_8d8);
      QString::~QString((QString *)0x9f0fbb);
      QString::~QString((QString *)0x9f0fc8);
      this_00 = local_928;
      this_01 = local_920;
    }
  }
  bVar2 = QTextFormat::hasProperty
                    ((QTextFormat *)in_stack_fffffffffffff1e0,in_stack_fffffffffffff1dc.i);
  if (bVar2) {
    local_958 = &DAT_aaaaaaaaaaaaaaaa;
    QTextFormat::background((QTextFormat *)this_00);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffff1e0,
               (QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
    QByteArrayView::QByteArrayView<17ul>
              ((QByteArrayView *)in_stack_fffffffffffff1e0,
               (char (*) [17])CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
    QVar36.m_data = local_9a0;
    QVar36.m_size = (qsizetype)local_990;
    QString::fromLatin1(QVar36);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffff1e0,
               (QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
    QBrush::color((QBrush *)0x9f1082);
    QColor::name(in_stack_fffffffffffff1e0,in_stack_fffffffffffff1dc.i);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffff1e0,
               (QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
    QXmlStreamWriter::writeAttribute((QAnyStringView *)in_RSI,local_968,local_960);
    QString::~QString((QString *)0x9f10f8);
    QString::~QString((QString *)0x9f1105);
    QBrush::~QBrush((QBrush *)0x9f1112);
    this_01 = local_9a8;
  }
  bVar2 = QTextFormat::hasProperty
                    ((QTextFormat *)in_stack_fffffffffffff1e0,in_stack_fffffffffffff1dc.i);
  if (bVar2) {
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffff1e0,
               (QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
    QByteArrayView::QByteArrayView<14ul>
              ((QByteArrayView *)in_stack_fffffffffffff1e0,
               (char (*) [14])CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
    QVar37.m_data = local_a10;
    QVar37.m_size = (qsizetype)local_a00;
    QString::fromLatin1(QVar37);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffff1e0,
               (QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
    bVar2 = QTextBlockFormat::nonBreakableLines((QTextBlockFormat *)0x9f11a6);
    if (bVar2) {
      QByteArrayView::QByteArrayView<5ul>
                ((QByteArrayView *)in_stack_fffffffffffff1e0,
                 (char (*) [5])CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
      QVar38.m_data = local_a48;
      QVar38.m_size = (qsizetype)local_a38;
      QString::fromLatin1(QVar38);
    }
    else {
      QByteArrayView::QByteArrayView<6ul>
                ((QByteArrayView *)in_stack_fffffffffffff1e0,
                 (char (*) [6])CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
      QVar39.m_data = local_a58;
      QVar39.m_size = (qsizetype)local_a38;
      QString::fromLatin1(QVar39);
    }
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffff1e0,
               (QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
    QXmlStreamWriter::writeAttribute((QAnyStringView *)in_RSI,local_9d8,local_9d0);
    QString::~QString((QString *)0x9f1274);
    QString::~QString((QString *)0x9f1281);
    this_01 = local_a18;
  }
  bVar2 = QTextFormat::hasProperty
                    ((QTextFormat *)in_stack_fffffffffffff1e0,in_stack_fffffffffffff1dc.i);
  if (bVar2) {
    local_a70 = &DAT_aaaaaaaaaaaaaaaa;
    local_a68 = &DAT_aaaaaaaaaaaaaaaa;
    local_a60 = &DAT_aaaaaaaaaaaaaaaa;
    QTextBlockFormat::tabPositions(in_stack_fffffffffffff1f0);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffff1e0,
               (QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
    QByteArrayView::QByteArrayView<10ul>
              ((QByteArrayView *)in_stack_fffffffffffff1e0,
               (char (*) [10])CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
    QVar40.m_data = local_ab8;
    QVar40.m_size = (qsizetype)local_aa8;
    QString::fromLatin1(QVar40);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffff1e0,
               (QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
    QXmlStreamWriter::writeStartElement((QAnyStringView *)in_RSI,local_a80);
    QString::~QString((QString *)0x9f1381);
    local_ac0.i = (Tab *)&DAT_aaaaaaaaaaaaaaaa;
    local_ac0 = QList<QTextOption::Tab>::begin((QList<QTextOption::Tab> *)this_01);
    while( true ) {
      o_00 = QList<QTextOption::Tab>::end((QList<QTextOption::Tab> *)this_01);
      bVar2 = QList<QTextOption::Tab>::iterator::operator!=(&local_ac0,o_00);
      if (!bVar2) break;
      pQVar49 = in_RSI;
      QAnyStringView::QAnyStringView
                ((QAnyStringView *)in_stack_fffffffffffff1e0,
                 (QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
      QByteArrayView::QByteArrayView<9ul>
                ((QByteArrayView *)in_stack_fffffffffffff1e0,
                 (char (*) [9])CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
      QVar41.m_data = local_b08;
      QVar41.m_size = (qsizetype)local_af8;
      QString::fromLatin1(QVar41);
      QAnyStringView::QAnyStringView
                ((QAnyStringView *)in_stack_fffffffffffff1e0,
                 (QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
      QXmlStreamWriter::writeEmptyElement((QAnyStringView *)pQVar49,local_ad0);
      QString::~QString((QString *)0x9f147f);
      pQVar49 = in_RSI;
      QAnyStringView::QAnyStringView
                ((QAnyStringView *)in_stack_fffffffffffff1e0,
                 (QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
      QByteArrayView::QByteArrayView<9ul>
                ((QByteArrayView *)in_stack_fffffffffffff1e0,
                 (char (*) [9])CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
      QVar42.m_data = local_b50;
      QVar42.m_size = (qsizetype)local_b40;
      QString::fromLatin1(QVar42);
      QAnyStringView::QAnyStringView
                ((QAnyStringView *)in_stack_fffffffffffff1e0,
                 (QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
      QList<QTextOption::Tab>::iterator::operator->(&local_ac0);
      pixelToPoint((qreal)in_stack_fffffffffffff1e0);
      QAnyStringView::QAnyStringView
                ((QAnyStringView *)in_stack_fffffffffffff1e0,
                 (QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
      other = local_b60;
      this_02 = pQStack_b58;
      QXmlStreamWriter::writeAttribute((QAnyStringView *)pQVar49,local_b18,local_b10);
      QString::~QString((QString *)0x9f1562);
      QString::~QString((QString *)0x9f156c);
      local_b88 = &DAT_aaaaaaaaaaaaaaaa;
      local_b98 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_b90 = &DAT_aaaaaaaaaaaaaaaa;
      QString::QString((QString *)0x9f159a);
      pTVar6 = QList<QTextOption::Tab>::iterator::operator->(&local_ac0);
      switch(pTVar6->type) {
      case LeftTab:
        QByteArrayView::QByteArrayView<5ul>
                  ((QByteArrayView *)in_stack_fffffffffffff1e0,
                   (char (*) [5])CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
        QVar44.m_data = local_be8;
        QVar44.m_size = (qsizetype)local_bd8;
        QString::fromLatin1(QVar44);
        QString::operator=(this_02,other);
        QString::~QString((QString *)0x9f1677);
        break;
      case RightTab:
        QByteArrayView::QByteArrayView<6ul>
                  ((QByteArrayView *)in_stack_fffffffffffff1e0,
                   (char (*) [6])CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
        QVar45.m_data = local_c10;
        QVar45.m_size = (qsizetype)local_c00;
        QString::fromLatin1(QVar45);
        QString::operator=(this_02,other);
        QString::~QString((QString *)0x9f16cf);
        break;
      case CenterTab:
        QByteArrayView::QByteArrayView<7ul>
                  ((QByteArrayView *)in_stack_fffffffffffff1e0,
                   (char (*) [7])CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
        QVar46.m_data = local_c38;
        QVar46.m_size = (qsizetype)local_c28;
        QString::fromLatin1(QVar46);
        QString::operator=(this_02,other);
        QString::~QString((QString *)0x9f1724);
        break;
      case DelimiterTab:
        QByteArrayView::QByteArrayView<5ul>
                  ((QByteArrayView *)in_stack_fffffffffffff1e0,
                   (char (*) [5])CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
        QVar43.m_data = local_bc0;
        QVar43.m_size = (qsizetype)local_bb0;
        QString::fromLatin1(QVar43);
        QString::operator=(this_02,other);
        QString::~QString((QString *)0x9f161f);
      }
      pQVar49 = in_RSI;
      QAnyStringView::QAnyStringView
                ((QAnyStringView *)in_stack_fffffffffffff1e0,
                 (QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
      QByteArrayView::QByteArrayView<5ul>
                ((QByteArrayView *)in_stack_fffffffffffff1e0,
                 (char (*) [5])CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
      QVar47.m_data = local_c80;
      QVar47.m_size = (qsizetype)local_c70;
      QString::fromLatin1(QVar47);
      QAnyStringView::QAnyStringView
                ((QAnyStringView *)in_stack_fffffffffffff1e0,
                 (QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
      QAnyStringView::QAnyStringView
                ((QAnyStringView *)in_stack_fffffffffffff1e0,
                 (QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
      this_01 = local_c88;
      QXmlStreamWriter::writeAttribute((QAnyStringView *)pQVar49,local_c48,local_c40);
      QString::~QString((QString *)0x9f17f4);
      pTVar6 = QList<QTextOption::Tab>::iterator::operator->(&local_ac0);
      bVar2 = QChar::isNull(&pTVar6->delimiter);
      if (!bVar2) {
        in_stack_fffffffffffff1e0 = in_RSI;
        QAnyStringView::QAnyStringView
                  ((QAnyStringView *)in_RSI,
                   (QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
        QByteArrayView::QByteArrayView<5ul>
                  ((QByteArrayView *)in_stack_fffffffffffff1e0,
                   (char (*) [5])CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
        QVar48.m_data = local_cd8;
        QVar48.m_size = (qsizetype)local_cc8;
        QString::fromLatin1(QVar48);
        QAnyStringView::QAnyStringView
                  ((QAnyStringView *)in_stack_fffffffffffff1e0,
                   (QString *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8));
        QList<QTextOption::Tab>::iterator::operator->(&local_ac0);
        QAnyStringView::QAnyStringView<QChar,_true>
                  ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff1dc.i,in_stack_fffffffffffff1d8)
                   ,(QChar *)this_01);
        this_01 = local_ce0;
        QXmlStreamWriter::writeAttribute
                  ((QAnyStringView *)in_stack_fffffffffffff1e0,local_ca0,local_c98);
        QString::~QString((QString *)0x9f18f1);
      }
      QList<QTextOption::Tab>::iterator::operator++(&local_ac0);
      QString::~QString((QString *)0x9f190b);
    }
    QXmlStreamWriter::writeEndElement();
    QList<QTextOption::Tab>::~QList((QList<QTextOption::Tab> *)0x9f192a);
  }
  QXmlStreamWriter::writeEndElement();
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextOdfWriter::writeBlockFormat(QXmlStreamWriter &writer, QTextBlockFormat format, int formatIndex) const
{
    writer.writeStartElement(styleNS, QString::fromLatin1("style"));
    writer.writeAttribute(styleNS, QString::fromLatin1("name"), QString::fromLatin1("p%1").arg(formatIndex));
    writer.writeAttribute(styleNS, QString::fromLatin1("family"), QString::fromLatin1("paragraph"));
    writer.writeStartElement(styleNS, QString::fromLatin1("paragraph-properties"));

    if (format.hasProperty(QTextBlockFormat::LineHeightType)) {
        const int blockLineHeightType = format.lineHeightType();
        const qreal blockLineHeight = format.lineHeight();
        QString type, value;
        switch (blockLineHeightType) {
        case QTextBlockFormat::SingleHeight:
            type = QString::fromLatin1("line-height");
            value = QString::fromLatin1("100%");
            break;
        case QTextBlockFormat::ProportionalHeight:
            type = QString::fromLatin1("line-height");
            value = QString::number(blockLineHeight) + QString::fromLatin1("%");
            break;
        case QTextBlockFormat::FixedHeight:
            type = QString::fromLatin1("line-height");
            value = pixelToPoint(qMax(qreal(0.), blockLineHeight));
            break;
        case QTextBlockFormat::MinimumHeight:
            type = QString::fromLatin1("line-height-at-least");
            value = pixelToPoint(qMax(qreal(0.), blockLineHeight));
            break;
        case QTextBlockFormat::LineDistanceHeight:
            type = QString::fromLatin1("line-spacing");
            value = pixelToPoint(qMax(qreal(0.), blockLineHeight));
        }

        if (!type.isNull())
            writer.writeAttribute(styleNS, type, value);
    }

    if (format.hasProperty(QTextFormat::BlockAlignment)) {
        const Qt::Alignment alignment = format.alignment() & Qt::AlignHorizontal_Mask;
        QString value;
        if (alignment == Qt::AlignLeading)
            value = QString::fromLatin1("start");
        else if (alignment == Qt::AlignTrailing)
            value = QString::fromLatin1("end");
        else if (alignment == (Qt::AlignLeft | Qt::AlignAbsolute))
            value = QString::fromLatin1("left");
        else if (alignment == (Qt::AlignRight | Qt::AlignAbsolute))
            value = QString::fromLatin1("right");
        else if (alignment == Qt::AlignHCenter)
            value = QString::fromLatin1("center");
        else if (alignment == Qt::AlignJustify)
            value = QString::fromLatin1("justify");
        else
            qWarning() << "QTextOdfWriter: unsupported paragraph alignment; " << format.alignment();
        if (! value.isNull())
            writer.writeAttribute(foNS, QString::fromLatin1("text-align"), value);
    }

    if (format.hasProperty(QTextFormat::BlockTopMargin))
        writer.writeAttribute(foNS, QString::fromLatin1("margin-top"), pixelToPoint(qMax(qreal(0.), format.topMargin())) );
    if (format.hasProperty(QTextFormat::BlockBottomMargin))
        writer.writeAttribute(foNS, QString::fromLatin1("margin-bottom"), pixelToPoint(qMax(qreal(0.), format.bottomMargin())) );
    if (format.hasProperty(QTextFormat::BlockLeftMargin) || format.hasProperty(QTextFormat::BlockIndent))
        writer.writeAttribute(foNS, QString::fromLatin1("margin-left"), pixelToPoint(qMax(qreal(0.),
            format.leftMargin() + format.indent())));
    if (format.hasProperty(QTextFormat::BlockRightMargin))
        writer.writeAttribute(foNS, QString::fromLatin1("margin-right"), pixelToPoint(qMax(qreal(0.), format.rightMargin())) );
    if (format.hasProperty(QTextFormat::TextIndent))
        writer.writeAttribute(foNS, QString::fromLatin1("text-indent"), pixelToPoint(format.textIndent()));
    if (format.hasProperty(QTextFormat::PageBreakPolicy)) {
        if (format.pageBreakPolicy() & QTextFormat::PageBreak_AlwaysBefore)
            writer.writeAttribute(foNS, QString::fromLatin1("break-before"), QString::fromLatin1("page"));
        if (format.pageBreakPolicy() & QTextFormat::PageBreak_AlwaysAfter)
            writer.writeAttribute(foNS, QString::fromLatin1("break-after"), QString::fromLatin1("page"));
    }
    if (format.hasProperty(QTextFormat::BackgroundBrush)) {
        QBrush brush = format.background();
        writer.writeAttribute(foNS, QString::fromLatin1("background-color"), brush.color().name());
    }
    if (format.hasProperty(QTextFormat::BlockNonBreakableLines))
        writer.writeAttribute(foNS, QString::fromLatin1("keep-together"),
                format.nonBreakableLines() ? QString::fromLatin1("true") : QString::fromLatin1("false"));
    if (format.hasProperty(QTextFormat::TabPositions)) {
        QList<QTextOption::Tab> tabs = format.tabPositions();
        writer.writeStartElement(styleNS, QString::fromLatin1("tab-stops"));
        QList<QTextOption::Tab>::Iterator iterator = tabs.begin();
        while(iterator != tabs.end()) {
            writer.writeEmptyElement(styleNS, QString::fromLatin1("tab-stop"));
            writer.writeAttribute(styleNS, QString::fromLatin1("position"), pixelToPoint(iterator->position) );
            QString type;
            switch(iterator->type) {
            case QTextOption::DelimiterTab: type = QString::fromLatin1("char"); break;
            case QTextOption::LeftTab: type = QString::fromLatin1("left"); break;
            case QTextOption::RightTab: type = QString::fromLatin1("right"); break;
            case QTextOption::CenterTab: type = QString::fromLatin1("center"); break;
            }
            writer.writeAttribute(styleNS, QString::fromLatin1("type"), type);
            if (!iterator->delimiter.isNull())
                writer.writeAttribute(styleNS, QString::fromLatin1("char"), iterator->delimiter);
            ++iterator;
        }

        writer.writeEndElement(); // tab-stops
    }

    writer.writeEndElement(); // paragraph-properties
    writer.writeEndElement(); // style
}